

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void pybind11::detail::
     process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_char[79]>
     ::postcall(function_call *call,handle fn_ret)

{
  function_call *call_local;
  handle fn_ret_local;
  
  process_attribute_default<pybind11::name>::postcall(call,fn_ret);
  process_attribute_default<pybind11::scope>::postcall(call,fn_ret);
  process_attribute_default<pybind11::sibling>::postcall(call,fn_ret);
  process_attribute_default<pybind11::arg>::postcall(call,fn_ret);
  process_attribute_default<const_char_*>::postcall(call,fn_ret);
  return;
}

Assistant:

static void postcall(function_call &call, handle fn_ret) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(call, fn_ret);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(fn_ret);
        using expander = int[];
        (void) expander{
            0, (process_attribute<typename std::decay<Args>::type>::postcall(call, fn_ret), 0)...};
    }